

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O1

loop_info * __thiscall
optimization::loop_expand::loop_info::operator++
          (loop_info *__return_storage_ptr__,loop_info *this,int param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  Op OVar4;
  int iVar5;
  int iVar6;
  loop_info *tag;
  char *pcVar7;
  Tag *tag_00;
  ostream local_111;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined **local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8;
  Function local_a0;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  __return_storage_ptr__->loop_start = this->loop_start;
  (__return_storage_ptr__->init_var).first.super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001ee058;
  (__return_storage_ptr__->init_var).first.id = (this->init_var).first.id;
  iVar6 = (this->init_var).second;
  (__return_storage_ptr__->init_var).second = iVar6;
  iVar3 = this->in_value;
  OVar4 = this->change_op;
  iVar5 = this->change_value;
  __return_storage_ptr__->in_op = this->in_op;
  __return_storage_ptr__->in_value = iVar3;
  __return_storage_ptr__->change_op = OVar4;
  __return_storage_ptr__->change_value = iVar5;
  (__return_storage_ptr__->phi_var).super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001ee058;
  (__return_storage_ptr__->phi_var).id = (this->phi_var).id;
  (__return_storage_ptr__->change_var).super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001ee058;
  (__return_storage_ptr__->change_var).id = (this->change_var).id;
  switch(this->change_op) {
  case Add:
    iVar6 = iVar6 + this->change_value;
    break;
  case Sub:
    iVar6 = iVar6 - this->change_value;
    break;
  case Mul:
    iVar6 = iVar6 * this->change_value;
    break;
  case Div:
    iVar6 = iVar6 / this->change_value;
    break;
  default:
    local_111 = (ostream)0x5;
    tag = this;
    AixLog::operator<<(&local_111,(Severity *)this);
    local_c8 = &local_b8;
    local_d0 = &PTR__Tag_001edee0;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    AixLog::operator<<((ostream *)&local_d0,(Tag *)tag);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)tag);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator++","");
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    paVar1 = &local_a0.name.field_2;
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    paVar2 = &local_a0.file.field_2;
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0xa6;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar7);
    pcVar7 = "ERROR ! Unrecognized change_op";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"ERROR ! Unrecognized change_op",0x1e);
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      pcVar7 = (char *)(CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                       1);
      operator_delete(local_110,(ulong)pcVar7);
    }
    if (local_f0 != &local_e0) {
      pcVar7 = (char *)(CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1)
      ;
      operator_delete(local_f0,(ulong)pcVar7);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 != &local_b8) {
      pcVar7 = (char *)(CONCAT71(uStack_b7,local_b8) + 1);
      operator_delete(local_c8,(ulong)pcVar7);
    }
    local_111 = (ostream)0x5;
    AixLog::operator<<(&local_111,(Severity *)pcVar7);
    local_d0 = &PTR__Tag_001edee0;
    local_c8 = &local_b8;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    AixLog::operator<<((ostream *)&local_d0,(Tag *)pcVar7);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar7);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator++","");
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    local_a0.name.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_a0.name.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_a0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0xa7;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar7);
    tag_00 = (Tag *)(ulong)this->change_op;
    mir::inst::display_op((ostream *)&std::clog,this->change_op);
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      tag_00 = (Tag *)(CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1
                      );
      operator_delete(local_110,(ulong)tag_00);
    }
    if (local_f0 != &local_e0) {
      tag_00 = (Tag *)(CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
      operator_delete(local_f0,(ulong)tag_00);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 != &local_b8) {
      tag_00 = (Tag *)(CONCAT71(uStack_b7,local_b8) + 1);
      operator_delete(local_c8,(ulong)tag_00);
    }
    local_111 = (ostream)0x5;
    AixLog::operator<<(&local_111,(Severity *)tag_00);
    local_d0 = &PTR__Tag_001edee0;
    local_c8 = &local_b8;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    AixLog::operator<<((ostream *)&local_d0,tag_00);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)tag_00);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator++","");
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    local_a0.name.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_a0.name.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_a0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0xa8;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ! ",3);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 == &local_b8) {
      return __return_storage_ptr__;
    }
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    return __return_storage_ptr__;
  case Rem:
    (this->init_var).second = iVar6 % this->change_value;
    return __return_storage_ptr__;
  }
  (this->init_var).second = iVar6;
  return __return_storage_ptr__;
}

Assistant:

loop_info operator++(int) {
    loop_info res(*this);
    switch (change_op) {
      case mir::inst::Op::Add: {
        init_var.second += change_value;
        break;
      }
      case mir::inst::Op::Sub: {
        init_var.second -= change_value;
        break;
      }
      case mir::inst::Op::Mul: {
        init_var.second *= change_value;
        break;
      }
      case mir::inst::Op::Div: {
        init_var.second /= change_value;
        break;
      }
      case mir::inst::Op::Rem: {
        init_var.second %= change_value;
        break;
      }
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized change_op";
        mir::inst::display_op(LOG(ERROR), change_op);
        LOG(ERROR) << " ! " << std::endl;
        break;
      }
    }
    return res;
  }